

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O0

void match_ctx_init(match_ctx *ctx,membuf *inbuf,int max_len,int max_offset,int use_imprecise_rle)

{
  uchar uVar1;
  ushort uVar2;
  int iVar3;
  uchar *puVar4;
  pre_calc (*papVar5) [1];
  unsigned_short *puVar6;
  match_node *pmVar7;
  match_node *pmVar8;
  const_matchp pmVar9;
  const_matchp matches;
  match_node *pmStack_58;
  unsigned_short rle_len;
  match_node *prev_np;
  int len;
  int val;
  int i;
  int c;
  uchar *buf;
  int buf_len;
  match_node *np;
  int use_imprecise_rle_local;
  int max_offset_local;
  int max_len_local;
  membuf *inbuf_local;
  match_ctx *ctx_local;
  
  iVar3 = membuf_memlen(inbuf);
  puVar4 = (uchar *)membuf_get(inbuf);
  papVar5 = (pre_calc (*) [1])calloc((long)(iVar3 + 1),0x10);
  ctx->info = papVar5;
  puVar6 = (unsigned_short *)calloc((long)(iVar3 + 1),2);
  ctx->rle = puVar6;
  puVar6 = (unsigned_short *)calloc((long)(iVar3 + 1),2);
  ctx->rle_r = puVar6;
  chunkpool_init(ctx->m_pool,0x10);
  ctx->max_offset = max_offset;
  ctx->max_len = max_len;
  ctx->buf = puVar4;
  ctx->len = iVar3;
  uVar1 = *puVar4;
  for (len = 1; len < iVar3; len = len + 1) {
    if (puVar4[len] == uVar1) {
      prev_np._0_4_ = ctx->rle[len + -1] + 1;
      if (0xffff < (uint)prev_np) {
        prev_np._0_4_ = 0;
      }
      ctx->rle[len] = (unsigned_short)(uint)prev_np;
    }
    else {
      ctx->rle[len] = 0;
    }
    uVar1 = puVar4[len];
  }
  for (len = iVar3 + -2; -1 < len; len = len + -1) {
    if (ctx->rle[len] < ctx->rle[len + 1]) {
      ctx->rle_r[len] = ctx->rle_r[len + 1] + 1;
    }
    else {
      ctx->rle_r[len] = 0;
    }
  }
  for (val = 0; val < 0x100; val = val + 1) {
    memset(match_ctx_init::rle_map,0,0x10000);
    pmStack_58 = (match_node *)0x0;
    for (len = 0; len < iVar3; len = len + 1) {
      if ((((uint)puVar4[len] == val) &&
          ((uVar2 = ctx->rle[len], match_ctx_init::rle_map[uVar2] != '\0' ||
           (ctx->rle_r[len] < 0x11)))) &&
         ((use_imprecise_rle == 0 || ((ctx->rle_r[len] == 0 || (ctx->rle[len] == 0)))))) {
        pmVar7 = (match_node *)chunkpool_malloc(ctx->m_pool);
        pmVar7->index = len;
        pmVar7->next = (match_node *)0x0;
        match_ctx_init::rle_map[uVar2] = '\x01';
        if (~LOG_FATAL < G_log_level) {
          G_log_log_level = LOG_DUMP;
          log_log_default("0) c = %d, added np idx %d -> %d\n",(ulong)(uint)val,(ulong)(uint)len,0);
        }
        if (pmStack_58 != (match_node *)0x0) {
          if (~LOG_FATAL < G_log_level) {
            G_log_log_level = LOG_DUMP;
            log_log_default("1) c = %d, pointed np idx %d -> %d\n",(ulong)(uint)val,
                            (ulong)(uint)pmStack_58->index,(ulong)(uint)len);
          }
          pmStack_58->next = pmVar7;
        }
        ctx->info[len][0].single = pmVar7;
        pmStack_58 = pmVar7;
      }
    }
    memset(match_ctx_init::rle_map,0,0x10000);
    pmStack_58 = (match_node *)0x0;
    len = iVar3;
    while (len = len + -1, -1 < len) {
      if ((uint)puVar4[len] == val) {
        pmVar7 = ctx->info[len][0].single;
        if ((((pmVar7 == (match_node *)0x0) &&
             (pmVar7 = pmStack_58, match_ctx_init::rle_map[ctx->rle_r[len]] != '\0')) &&
            (pmStack_58 != (match_node *)0x0)) && (ctx->rle_r[len] != 0)) {
          pmVar8 = (match_node *)chunkpool_malloc(ctx->m_pool);
          pmVar8->index = len;
          pmVar8->next = pmStack_58;
          ctx->info[len][0].single = pmVar8;
          if (~LOG_ERROR < G_log_level) {
            G_log_log_level = LOG_DEBUG;
            log_log_default("2) c = %d, added np idx %d -> %d\n",(ulong)(uint)val,(ulong)(uint)len,
                            (ulong)(uint)pmStack_58->index);
          }
        }
        pmStack_58 = pmVar7;
        if (ctx->rle_r[len] == 0) {
          match_ctx_init::rle_map[(ushort)(ctx->rle[len] + 1)] = '\x01';
        }
      }
    }
  }
  while (len = iVar3 + -1, -1 < len) {
    pmVar9 = matches_calc(ctx,len);
    ctx->info[len][0].cache = pmVar9;
    iVar3 = len;
  }
  return;
}

Assistant:

void match_ctx_init(match_ctx ctx,         /* IN/OUT */
                    struct membuf *inbuf,  /* IN */
                    int max_len,           /* IN */
                    int max_offset,        /* IN */
                    int use_imprecise_rle) /* IN */
{
    struct match_node *np;

    int buf_len = membuf_memlen(inbuf);
    const unsigned char *buf = membuf_get(inbuf);

    int c, i;
    int val;

    ctx->info = calloc(buf_len + 1, sizeof(*ctx->info));
    ctx->rle = calloc(buf_len + 1, sizeof(*ctx->rle));
    ctx->rle_r = calloc(buf_len + 1, sizeof(*ctx->rle_r));

    chunkpool_init(ctx->m_pool, sizeof(match));

    ctx->max_offset = max_offset;
    ctx->max_len = max_len;

    ctx->buf = buf;
    ctx->len = buf_len;

    val = buf[0];
    for (i = 1; i < buf_len; ++i)
    {
        if (buf[i] == val)
        {
            int len = ctx->rle[i - 1] + 1;
            if(len > 65535)
            {
                len = 0;
            }
            ctx->rle[i] = len;
        } else
        {
            ctx->rle[i] = 0;
        }
        val = buf[i];
    }

    for (i = buf_len - 2; i >= 0; --i)
    {
        if (ctx->rle[i] < ctx->rle[i + 1])
        {
            ctx->rle_r[i] = ctx->rle_r[i + 1] + 1;
        } else
        {
            ctx->rle_r[i] = 0;
        }
    }

    /* add extra nodes to rle sequences */
    for(c = 0; c < 256; ++c)
    {
        static char rle_map[65536];
        struct match_node *prev_np;
        unsigned short int rle_len;

        /* for each possible rle char */
        memset(rle_map, 0, sizeof(rle_map));
        prev_np = NULL;
        for (i = 0; i < buf_len; ++i)
        {
            /* must be the correct char */
            if(buf[i] != c)
            {
                continue;
            }

            rle_len = ctx->rle[i];
            if(!rle_map[rle_len] && ctx->rle_r[i] > 16)
            {
                /* no previous lengths and not our primary length*/
                continue;
            }

            if (use_imprecise_rle &&
                ctx->rle_r[i] != 0 && ctx->rle[i] != 0)
            {
                continue;
            }

            np = chunkpool_malloc(ctx->m_pool);
            np->index = i;
            np->next = NULL;
            rle_map[rle_len] = 1;

            LOG(LOG_DUMP, ("0) c = %d, added np idx %d -> %d\n", c, i, 0));

            /* if we have a previous entry, let's chain it together */
            if(prev_np != NULL)
            {
                LOG(LOG_DUMP, ("1) c = %d, pointed np idx %d -> %d\n",
                                c, prev_np->index, i));
                prev_np->next = np;
            }

            ctx->info[i]->single = np;
            prev_np = np;
        }

        memset(rle_map, 0, sizeof(rle_map));
        prev_np = NULL;
        for (i = buf_len - 1; i >= 0; --i)
        {
            /* must be the correct char */
            if(buf[i] != c)
            {
                continue;
            }

            rle_len = ctx->rle_r[i];
            np = ctx->info[i]->single;
            if(np == NULL)
            {
                if(rle_map[rle_len] && prev_np != NULL && rle_len > 0)
                {
                    np = chunkpool_malloc(ctx->m_pool);
                    np->index = i;
                    np->next = prev_np;
                    ctx->info[i]->single = np;

                    LOG(LOG_DEBUG, ("2) c = %d, added np idx %d -> %d\n",
                                    c, i, prev_np->index));
                }
            }
            else
            {
                prev_np = np;
            }

            if(ctx->rle_r[i] > 0)
            {
                continue;
            }
            rle_len = ctx->rle[i] + 1;
            rle_map[rle_len] = 1;
        }
    }


    for (i = buf_len - 1; i >= 0; --i)
    {
        const_matchp matches;

        /* let's populate the cache */
        matches = matches_calc(ctx, i);

        /* add to cache */
        ctx->info[i]->cache = matches;

    }

}